

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

int bfgs_min2(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
             double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
             double xtol,double *xf)

{
  bool bVar1;
  double dVar2;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  void *__ptr;
  double *L_00;
  double *jac_00;
  double *jacf;
  double *step;
  double *L;
  double *xc;
  double *scheck;
  double *hess;
  double *jac;
  double alpha;
  double fo;
  double eps2;
  double fxf;
  double stop0;
  double den;
  double num;
  double fx;
  double dt2;
  double dt1;
  int local_80;
  int retval;
  int siter;
  int i;
  int gfdcode;
  int rcode;
  double xtol_local;
  double ftol_local;
  double gtol_local;
  double eps_local;
  double maxstep_local;
  double fsval_local;
  double *dx_local;
  int m_local;
  int N_local;
  double *xi_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  _gfdcode = xtol;
  xtol_local = ftol;
  ftol_local = gtol;
  gtol_local = eps;
  eps_local = maxstep;
  maxstep_local = fsval;
  fsval_local = (double)dx;
  dx_local._0_4_ = m;
  dx_local._4_4_ = N;
  _m_local = xi;
  xi_local = (double *)funcgrad;
  funcgrad_local = (custom_gradient *)funcpt;
  f = (double *)malloc((long)N << 3);
  array = (double *)malloc((long)dx_local._4_4_ << 3);
  xi_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  x = (double *)malloc((long)dx_local._4_4_ << 3);
  __ptr = malloc((long)dx_local._4_4_ * 8 * (long)dx_local._4_4_);
  L_00 = (double *)malloc((long)dx_local._4_4_ * 8 * (long)dx_local._4_4_);
  jac_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  i = 0;
  *niter = 0;
  local_80 = MAXITER;
  fo = sqrt(gtol_local);
  jac = (double *)0x3ff0000000000000;
  siter = 0;
  for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
    _m_local[retval] = *(double *)((long)fsval_local + (long)retval * 8) * _m_local[retval];
    *(double *)((long)fsval_local + (long)retval * 8) =
         1.0 / *(double *)((long)fsval_local + (long)retval * 8);
  }
  num = (double)(*funcgrad_local->funcgrad)
                          (_m_local,dx_local._4_4_,(double *)funcgrad_local->params,funcgrad_local);
  if ((1.79769313486232e+308 <= num) || (num <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    i = 0xf;
  }
  if (NAN(num)) {
    printf("Program Exiting as the function returns NaN");
    i = 0xf;
  }
  alpha = num;
  siter = grad_fd((custom_function *)funcgrad_local,(custom_gradient *)xi_local,_m_local,
                  dx_local._4_4_,(double *)fsval_local,fo,f);
  if (siter == 0xf) {
    i = 0xf;
  }
  if (eps_local <= 0.0) {
    eps_local = 1000.0;
    fx = 0.0;
    dt2 = 0.0;
    for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
      dt2 = *(double *)((long)fsval_local + (long)retval * 8) *
            *(double *)((long)fsval_local + (long)retval * 8) + dt2;
      fx = *(double *)((long)fsval_local + (long)retval * 8) * _m_local[retval] *
           *(double *)((long)fsval_local + (long)retval * 8) * _m_local[retval] + fx;
    }
    dt2 = sqrt(dt2);
    fx = sqrt(fx);
    dVar2 = fx;
    if (fx < dt2) {
      dVar2 = dt2;
    }
    eps_local = dVar2 * eps_local;
  }
  dVar2 = maxstep_local;
  if (ABS(maxstep_local) < ABS(num)) {
    dVar2 = num;
  }
  stop0 = ABS(dVar2);
  for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
    if (ABS(_m_local[retval]) <= 1.0 / ABS(*(double *)((long)fsval_local + (long)retval * 8))) {
      den = 1.0 / ABS(*(double *)((long)fsval_local + (long)retval * 8));
    }
    else {
      den = ABS(_m_local[retval]);
    }
    array[retval] = (ABS(f[retval]) * den) / stop0;
  }
  fxf = array_max_abs(array,dx_local._4_4_);
  if (fxf <= ftol_local * 0.001) {
    i = 1;
    for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
      xf[retval] = _m_local[retval];
    }
  }
  inithess_lower(L_00,dx_local._4_4_,num,maxstep_local,(double *)fsval_local);
  for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
    xi_00[retval] = _m_local[retval];
  }
  eps2 = num;
  while( true ) {
    bVar1 = false;
    if (i == 0) {
      bVar1 = *niter < local_80;
    }
    if (!bVar1) break;
    *niter = *niter + 1;
    scale(f,1,dx_local._4_4_,-1.0);
    linsolve_lower(L_00,dx_local._4_4_,f,x);
    scale(f,1,dx_local._4_4_,-1.0);
    for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
      jac_00[retval] = f[retval];
    }
    dt1._4_4_ = lnsrchmt((custom_function *)funcgrad_local,(custom_gradient *)xi_local,xi_00,&eps2,f
                         ,(double *)&jac,x,dx_local._4_4_,(double *)fsval_local,eps_local,MAXITER,fo
                         ,xtol_local,ftol_local,_gfdcode,xf);
    i = stopcheck2_mt(eps2,dx_local._4_4_,alpha,f,(double *)fsval_local,gtol_local,ftol_local,
                      xtol_local,dt1._4_4_);
    alpha = eps2;
    bfgs_factored(L_00,dx_local._4_4_,gtol_local,xi_00,xf,jac_00,f);
    for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
      xi_00[retval] = xf[retval];
    }
  }
  if ((i == 0) && (local_80 <= *niter)) {
    i = 4;
  }
  for (retval = 0; retval < dx_local._4_4_; retval = retval + 1) {
    _m_local[retval] = *(double *)((long)fsval_local + (long)retval * 8) * _m_local[retval];
    *(double *)((long)fsval_local + (long)retval * 8) =
         1.0 / *(double *)((long)fsval_local + (long)retval * 8);
  }
  free(f);
  free(__ptr);
  free(array);
  free(xi_00);
  free(L_00);
  free(x);
  free(jac_00);
  return i;
}

Assistant:

int bfgs_min2(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval, double maxstep, int MAXITER, int *niter,
	double eps, double gtol, double ftol, double xtol, double *xf)  {
	int rcode, gfdcode;
	int i, siter, retval;
	double dt1, dt2;
	double fx, num, den, stop0, fxf, eps2,fo,alpha;
	double *jac, *hess, *scheck, *xc, *L, *step, *jacf;

	jac = (double*)malloc(sizeof(double)*N);
	scheck = (double*)malloc(sizeof(double)*N);
	xc = (double*)malloc(sizeof(double)*N);
	step = (double*)malloc(sizeof(double)*N);
	hess = (double*)malloc(sizeof(double)*N * N);
	L = (double*)malloc(sizeof(double)*N * N);
	jacf = (double*)malloc(sizeof(double)*N);

	/*
	* Return Codes
	*
	* Codes 1,2,3 denote possible success.
	* Codes 0 and 4 denote failure.
	*
	* 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	* 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	* 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	* 4 - Iteration Limit exceeded. Convergence not achieved.
	* 15 -Failure as Inf/Nan Values encountered
	*
	*/

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;

	//set values
	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	fo = fx;

	gfdcode = grad_fd(funcpt, funcgrad, xi, N, dx, eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}


	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
		den = fabs(fx);
	}
	else {
		den = fabs(fsval);
	}
	for (i = 0; i < N; ++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		}
		else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck, N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for (i = 0; i < N; ++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_lower(L, N, fx, fsval, dx);

	for (i = 0; i < N; ++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		scale(jac, 1, N, -1.0);

		linsolve_lower(L, N, jac, step);

		scale(jac, 1, N, -1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//retval = lnsrch(funcpt, xc, jac, step, N, dx, maxstep, stol, xf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);

		//rcode = stopcheck(fxf, N, xc, xf, jacf, dx, fsval, gtol, stol, retval);
		rcode = stopcheck2_mt(fxf, N, fo, jac, dx, eps, gtol, ftol, retval);
		fo = fxf;
		//hessian_fd(funcpt,xf,N,dx,hess);
		//bfgs_naive(hess,N,xc,xf,jac,jacf);
		bfgs_factored(L, N, eps, xc, xf, jacf, jac);
		for (i = 0; i < N; ++i) {
			xc[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	for (i = 0; i < N; ++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}

	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}